

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O2

bool __thiscall
kj::anon_unknown_35::InMemoryDirectory::tryTransfer
          (InMemoryDirectory *this,PathPtr toPath,WriteMode toMode,Directory *fromDirectory,
          PathPtr fromPath,TransferMode mode)

{
  _Base_ptr p_Var1;
  PathPtr fromPath_00;
  undefined8 uVar2;
  undefined1 uVar3;
  bool bVar4;
  Maybe<kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl_&> entry;
  long lVar5;
  Maybe<kj::_::Mutex::Waiter_&> *pMVar6;
  char *pcVar7;
  _Base_ptr p_Var8;
  Impl *this_00;
  StringPtr name;
  StringPtr name_00;
  bool needRollback;
  Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl> lock;
  Fault f;
  Fault f_1;
  bool local_c1;
  TransferMode local_c0;
  Type local_bc;
  undefined1 local_b8 [16];
  Deferred<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_filesystem_c__:1278:11)>
  local_a8;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Absolute<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::_::DateLabel>_>_2
  local_88;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 local_70;
  Fault local_68;
  Maybe<kj::_::Mutex::Waiter_&> local_60;
  Maybe<kj::_::Mutex::Waiter_&> *local_58;
  Maybe<unsigned_long> local_50;
  Maybe<kj::Absolute<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::_::DateLabel>_> local_40;
  
  pMVar6 = (Maybe<kj::_::Mutex::Waiter_&> *)toPath.parts.size_;
  p_Var8 = (_Base_ptr)toPath.parts.ptr;
  local_c0 = mode;
  local_60.ptr = (Waiter *)p_Var8;
  local_58 = pMVar6;
  if (pMVar6 == (Maybe<kj::_::Mutex::Waiter_&> *)0x1) {
    (*(fromDirectory->super_ReadableDirectory).super_FsNode._vptr_FsNode[9])
              (&local_a8,fromDirectory,fromPath.parts.ptr,fromPath.parts.size_);
    if ((char)local_a8.func.needRollback != '\0') {
      local_bc = (Type)local_a8.func.lock;
      local_70 = (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2)local_a8.func.toPath;
      kj::_::Mutex::lock(&(this->impl).mutex,EXCLUSIVE);
      this_00 = &(this->impl).value;
      p_Var1 = p_Var8->_M_parent;
      if (p_Var1 == (_Base_ptr)0x0) {
        pcVar7 = "";
      }
      else {
        pcVar7 = *(char **)p_Var8;
      }
      name_00.content.size_ = (long)&p_Var1->_M_color + (ulong)(p_Var1 == (_Base_ptr)0x0);
      name_00.content.ptr = pcVar7;
      local_b8._0_8_ = &this->impl;
      local_b8._8_8_ = this_00;
      entry = Impl::openEntry(this_00,name_00,toMode);
      if (entry.ptr == (EntryImpl *)0x0) {
        bVar4 = false;
      }
      else {
        local_c1 = ((entry.ptr)->node).tag == 0;
        local_a8.func.needRollback = &local_c1;
        local_a8.func.lock = (Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)local_b8;
        local_a8.func.toPath = (PathPtr *)&local_60;
        local_a8.canceled = false;
        local_40.ptr.isSet = true;
        local_40.ptr.field_1 = local_88;
        local_50.ptr.isSet = true;
        local_50.ptr.field_1 = local_70;
        fromPath_00.parts.ptr._4_4_ = fromPath.parts.ptr._4_4_;
        fromPath_00.parts.ptr._0_4_ = fromPath.parts.ptr._0_4_;
        fromPath_00.parts.size_._0_4_ = (undefined4)fromPath.parts.size_;
        fromPath_00.parts.size_._4_4_ = fromPath.parts.size_._4_4_;
        bVar4 = Impl::tryTransferChild
                          (this_00,entry.ptr,local_bc,&local_40,&local_50,fromDirectory,fromPath_00,
                           local_c0);
        uVar2 = local_b8._8_8_;
        if (bVar4) {
          lVar5 = (*(code *)**(undefined8 **)*(_func_int **)local_b8._8_8_)();
          (((Date *)(uVar2 + 0x38))->value).value = lVar5;
          local_c1 = false;
        }
        else {
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[51],kj::PathPtr&>
                    (&local_68,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
                     ,0x506,FAILED,(char *)0x0,
                     "\"InMemoryDirectory can\'t link an inode of this type\", fromPath",
                     (char (*) [51])"InMemoryDirectory can\'t link an inode of this type",&fromPath)
          ;
          kj::_::Debug::Fault::~Fault(&local_68);
        }
        kj::_::
        Deferred<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++:1278:11)>
        ::~Deferred(&local_a8);
      }
      Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl>::~Locked
                ((Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)local_b8);
      return bVar4;
    }
  }
  else {
    if (pMVar6 != (Maybe<kj::_::Mutex::Waiter_&> *)0x0) {
      p_Var1 = p_Var8->_M_parent;
      if (p_Var1 == (_Base_ptr)0x0) {
        pcVar7 = "";
      }
      else {
        pcVar7 = *(char **)p_Var8;
      }
      name.content.size_ = (size_t)pcVar7;
      name.content.ptr = (char *)this;
      tryGetParent((InMemoryDirectory *)local_b8,name,(int)p_Var1 + (uint)(p_Var1 == (_Base_ptr)0x0)
                  );
      uVar2 = local_b8._8_8_;
      local_a8.func.needRollback = (bool *)local_b8._0_8_;
      local_a8.func.lock =
           (Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)local_b8._8_8_;
      local_b8._8_8_ = (_func_int **)0x0;
      Own<const_kj::Directory>::dispose((Own<const_kj::Directory> *)local_b8);
      if ((Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)uVar2 ==
          (Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)0x0) {
        uVar3 = 0;
      }
      else {
        uVar3 = (**(code **)(*(_func_int **)uVar2 + 0xa0))
                          (uVar2,&p_Var8->_M_right,(undefined1 *)((long)&pMVar6[-1].ptr + 7),toMode,
                           fromDirectory,local_c0,fromPath.parts.ptr._0_4_,
                           (undefined4)fromPath.parts.size_);
      }
      Own<const_kj::Directory>::dispose((Own<const_kj::Directory> *)&local_a8);
      return (bool)uVar3;
    }
    if ((toMode & CREATE) == 0) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[19]>
                ((Fault *)&local_a8,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
                 ,0x4f4,FAILED,(char *)0x0,"\"can\'t replace self\"",
                 (char (*) [19])"can\'t replace self");
      kj::_::Debug::Fault::~Fault((Fault *)&local_a8);
      return false;
    }
  }
  return false;
}

Assistant:

bool tryTransfer(PathPtr toPath, WriteMode toMode,
                   const Directory& fromDirectory, PathPtr fromPath,
                   TransferMode mode) const override {
    if (toPath.size() == 0) {
      if (has(toMode, WriteMode::CREATE)) {
        return false;
      } else {
        KJ_FAIL_REQUIRE("can't replace self") { return false; }
      }
    } else if (toPath.size() == 1) {
      // tryTransferChild() needs to at least know the node type, so do an lstat.
      KJ_IF_MAYBE(meta, fromDirectory.tryLstat(fromPath)) {
        auto lock = impl.lockExclusive();
        KJ_IF_MAYBE(entry, lock->openEntry(toPath[0], toMode)) {
          // Make sure if we just cerated a new entry, and we don't successfully transfer to it, we
          // remove the entry before returning.
          bool needRollback = entry->node == nullptr;
          KJ_DEFER(if (needRollback) { lock->entries.erase(toPath[0]); });

          if (lock->tryTransferChild(*entry, meta->type, meta->lastModified, meta->size,
                                     fromDirectory, fromPath, mode)) {
            lock->modified();
            needRollback = false;
            return true;
          } else {
            KJ_FAIL_REQUIRE("InMemoryDirectory can't link an inode of this type", fromPath) {
              return false;
            }
          }
        } else {
          return false;
        }
      } else {
        return false;
      }
    } else {
      // TODO(someday): Ideally we wouldn't create parent directories if fromPath doesn't exist.
      //   This requires a different approach to the code here, though.
      KJ_IF_MAYBE(child, tryGetParent(toPath[0], toMode)) {
        return child->get()->tryTransfer(
            toPath.slice(1, toPath.size()), toMode, fromDirectory, fromPath, mode);
      } else {
        return false;
      }
    }
  }